

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O2

int getevents(int s,int events,int timeout)

{
  uint __i;
  int iVar1;
  int iVar2;
  long lVar3;
  uint *puVar4;
  char *pcVar5;
  ulong uVar6;
  FILE *__stream;
  timeval *__timeout;
  uint uVar7;
  uint uVar8;
  undefined8 uStack_e0;
  int sndfd;
  int rcvfd;
  size_t fdsz;
  timeval tv;
  fd_set pollset;
  
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    pollset.fds_bits[lVar3] = 0;
  }
  iVar1 = 0;
  if ((events & 1U) == 0) {
LAB_0010171a:
    if ((events & 2U) != 0) {
      fdsz = 4;
      iVar2 = nn_getsockopt(s,0,10,&sndfd);
      if (iVar2 != 0) {
        nn_backtrace_print();
        __stream = _stderr;
        puVar4 = (uint *)__errno_location();
        pcVar5 = nn_err_strerror(*puVar4);
        uVar6 = (ulong)*puVar4;
        uStack_e0 = 0x5e;
        goto LAB_001018a7;
      }
      if (fdsz != 4) {
        nn_backtrace_print();
        pcVar5 = "fdsz == sizeof (sndfd)";
        uStack_e0 = 0x5f;
        goto LAB_00101909;
      }
      pollset.fds_bits[sndfd / 0x40] = pollset.fds_bits[sndfd / 0x40] | 1L << ((byte)sndfd & 0x3f);
      if (iVar1 <= sndfd) {
        iVar1 = sndfd + 1;
      }
    }
    if (-1 < timeout) {
      tv.tv_sec = (ulong)(uint)timeout / 1000;
      tv.tv_usec = (__suseconds_t)(((uint)timeout % 1000) * 1000);
    }
    uVar7 = 0;
    __timeout = &tv;
    if (timeout < 0) {
      __timeout = (timeval *)(timeval *)0x0;
    }
    iVar1 = select(iVar1,(fd_set *)&pollset,(fd_set *)0x0,(fd_set *)0x0,(timeval *)__timeout);
    if (-1 < iVar1) {
      if ((events & 1U) != 0) {
        uVar7 = (uint)(((ulong)pollset.fds_bits[rcvfd / 0x40] >> ((long)rcvfd % 0x40 & 0x3fU) & 1)
                      != 0);
      }
      uVar8 = uVar7;
      if (((events & 2U) != 0) &&
         (uVar8 = uVar7 + 2,
         ((ulong)pollset.fds_bits[sndfd / 0x40] >> ((long)sndfd % 0x40 & 0x3fU) & 1) == 0)) {
        uVar8 = uVar7;
      }
      return uVar8;
    }
    nn_backtrace_print();
    __stream = _stderr;
    puVar4 = (uint *)__errno_location();
    pcVar5 = nn_err_strerror(*puVar4);
    uVar6 = (ulong)*puVar4;
    uStack_e0 = 0x70;
  }
  else {
    fdsz = 4;
    iVar1 = nn_getsockopt(s,0,0xb,&rcvfd);
    if (iVar1 == 0) {
      if (fdsz == 4) {
        pollset.fds_bits[rcvfd / 0x40] = pollset.fds_bits[rcvfd / 0x40] | 1L << ((byte)rcvfd & 0x3f)
        ;
        iVar1 = 0;
        if (-1 < rcvfd) {
          iVar1 = rcvfd + 1;
        }
        goto LAB_0010171a;
      }
      nn_backtrace_print();
      pcVar5 = "fdsz == sizeof (rcvfd)";
      uStack_e0 = 0x53;
LAB_00101909:
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar5,
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/poll.c",
              uStack_e0);
      goto LAB_00101915;
    }
    nn_backtrace_print();
    __stream = _stderr;
    puVar4 = (uint *)__errno_location();
    pcVar5 = nn_err_strerror(*puVar4);
    uVar6 = (ulong)*puVar4;
    uStack_e0 = 0x52;
  }
LAB_001018a7:
  fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar5,uVar6,
          "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/poll.c",
          uStack_e0);
LAB_00101915:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int getevents (int s, int events, int timeout)
{
    int rc;
    fd_set pollset;
#if defined NN_HAVE_WINDOWS
    SOCKET rcvfd;
    SOCKET sndfd;
#else
    int rcvfd;
    int sndfd;
    int maxfd;
#endif
    size_t fdsz;
    struct timeval tv;
    int revents;

#if !defined NN_HAVE_WINDOWS
    maxfd = 0;
#endif
    FD_ZERO (&pollset);

    if (events & NN_IN) {
        fdsz = sizeof (rcvfd);
        rc = nn_getsockopt (s, NN_SOL_SOCKET, NN_RCVFD, (char*) &rcvfd, &fdsz);
        errno_assert (rc == 0);
        nn_assert (fdsz == sizeof (rcvfd));
        FD_SET (rcvfd, &pollset);
#if !defined NN_HAVE_WINDOWS
        if (rcvfd + 1 > maxfd)
            maxfd = rcvfd + 1;
#endif
    }

    if (events & NN_OUT) {
        fdsz = sizeof (sndfd);
        rc = nn_getsockopt (s, NN_SOL_SOCKET, NN_SNDFD, (char*) &sndfd, &fdsz);
        errno_assert (rc == 0);
        nn_assert (fdsz == sizeof (sndfd));
        FD_SET (sndfd, &pollset);
#if !defined NN_HAVE_WINDOWS
        if (sndfd + 1 > maxfd)
            maxfd = sndfd + 1;
#endif
    }

    if (timeout >= 0) {
        tv.tv_sec = timeout / 1000;
        tv.tv_usec = (timeout % 1000) * 1000;
    }
#if defined NN_HAVE_WINDOWS
    rc = select (0, &pollset, NULL, NULL, timeout < 0 ? NULL : &tv);
    wsa_assert (rc != SOCKET_ERROR);
#else
    rc = select (maxfd, &pollset, NULL, NULL, timeout < 0 ? NULL : &tv);
    errno_assert (rc >= 0);
#endif
    revents = 0;
    if ((events & NN_IN) && FD_ISSET (rcvfd, &pollset))
        revents |= NN_IN;
    if ((events & NN_OUT) && FD_ISSET (sndfd, &pollset))
        revents |= NN_OUT;
    return revents;
}